

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LJ.cpp
# Opt level: O0

void __thiscall
OpenMD::LJ::addExplicitInteraction
          (LJ *this,AtomType *atype1,AtomType *atype2,RealType sigma,RealType epsilon)

{
  value_type vVar1;
  reference pvVar2;
  _Rb_tree_const_iterator<int> __new_size;
  reference pvVar3;
  reference pvVar4;
  bool bVar5;
  AtomType *in_RDX;
  AtomType *in_RSI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> *in_RDI;
  double in_XMM0_Qa;
  RealType in_XMM1_Qa;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar6;
  pair<std::_Rb_tree_const_iterator<int>,_bool> ret;
  int ljtid2;
  int ljtid1;
  int atid2;
  int atid1;
  LJInteractionData mixer;
  _Rb_tree_const_iterator<int> in_stack_ffffffffffffff68;
  bool in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff71;
  pair<std::_Rb_tree_const_iterator<int>,_bool> local_78;
  pair<std::_Rb_tree_const_iterator<int>,_bool> local_68;
  value_type local_58;
  value_type local_54;
  int local_50;
  int local_4c;
  RealType local_48;
  RealType local_40;
  RealType local_38;
  undefined1 local_30;
  undefined7 uStack_2f;
  AtomType *local_18;
  
  local_38 = 1.0 / in_XMM0_Qa;
  local_30 = 1;
  local_48 = in_XMM0_Qa;
  local_40 = in_XMM1_Qa;
  local_18 = in_RDX;
  local_4c = AtomType::getIdent(in_RSI);
  local_50 = AtomType::getIdent(local_18);
  std::pair<std::_Rb_tree_const_iterator<int>,_bool>::
  pair<std::_Rb_tree_const_iterator<int>,_bool,_true>(in_RDI);
  pVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     CONCAT71(in_stack_ffffffffffffff71,in_stack_ffffffffffffff70),
                     (value_type_conflict *)in_stack_ffffffffffffff68._M_node);
  local_78.first = pVar6.first._M_node;
  local_78.second = pVar6.second;
  std::pair<std::_Rb_tree_const_iterator<int>,_bool>::operator=(&local_68,&local_78);
  if ((local_68.second & 1U) == 0) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 4),(long)local_4c);
    local_54 = *pvVar2;
  }
  else {
    local_54 = *(value_type *)&in_RDI[7].first._M_node;
    vVar1 = *(value_type *)&in_RDI[7].first._M_node;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 4),(long)local_4c);
    *pvVar2 = vVar1;
    *(int *)&in_RDI[7].first._M_node = *(int *)&in_RDI[7].first._M_node + 1;
  }
  pVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     CONCAT71(in_stack_ffffffffffffff71,in_stack_ffffffffffffff70),
                     (value_type_conflict *)in_stack_ffffffffffffff68._M_node);
  __new_size = pVar6.first._M_node;
  bVar5 = pVar6.second;
  std::pair<std::_Rb_tree_const_iterator<int>,_bool>::operator=
            (&local_68,(type)&stack0xffffffffffffff68);
  if ((local_68.second & 1U) == 0) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 4),(long)local_50);
    local_58 = *pvVar2;
  }
  else {
    local_58 = *(value_type *)&in_RDI[7].first._M_node;
    vVar1 = *(value_type *)&in_RDI[7].first._M_node;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 4),(long)local_50);
    *pvVar2 = vVar1;
    *(int *)&in_RDI[7].first._M_node = *(int *)&in_RDI[7].first._M_node + 1;
  }
  std::
  vector<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
  ::resize((vector<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
            *)CONCAT71(in_stack_ffffffffffffff71,bVar5),(size_type)__new_size._M_node);
  std::
  vector<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
  ::operator[]((vector<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
                *)&in_RDI[5].second,(long)local_54);
  std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>::resize
            ((vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_> *)
             CONCAT71(in_stack_ffffffffffffff71,bVar5),(size_type)__new_size._M_node);
  pvVar3 = std::
           vector<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
           ::operator[]((vector<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
                         *)&in_RDI[5].second,(long)local_54);
  pvVar4 = std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>::
           operator[](pvVar3,(long)local_58);
  pvVar4->sigma = local_48;
  pvVar4->epsilon = local_40;
  pvVar4->sigmai = local_38;
  *(ulong *)&pvVar4->explicitlySet = CONCAT71(uStack_2f,local_30);
  if (local_58 != local_54) {
    std::
    vector<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
    ::operator[]((vector<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
                  *)&in_RDI[5].second,(long)local_58);
    std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>::resize
              ((vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_> *)
               CONCAT71(in_stack_ffffffffffffff71,bVar5),(size_type)__new_size._M_node);
    pvVar3 = std::
             vector<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
             ::operator[]((vector<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
                           *)&in_RDI[5].second,(long)local_58);
    pvVar4 = std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>::
             operator[](pvVar3,(long)local_54);
    pvVar4->sigma = local_48;
    pvVar4->epsilon = local_40;
    pvVar4->sigmai = local_38;
    *(ulong *)&pvVar4->explicitlySet = CONCAT71(uStack_2f,local_30);
  }
  return;
}

Assistant:

void LJ::addExplicitInteraction(AtomType* atype1, AtomType* atype2,
                                  RealType sigma, RealType epsilon) {
    LJInteractionData mixer;
    mixer.sigma         = sigma;
    mixer.epsilon       = epsilon;
    mixer.sigmai        = 1.0 / mixer.sigma;
    mixer.explicitlySet = true;

    int atid1 = atype1->getIdent();
    int atid2 = atype2->getIdent();

    int ljtid1, ljtid2;

    pair<set<int>::iterator, bool> ret;
    ret = LJtypes.insert(atid1);
    if (ret.second == false) {
      // already had this type in the LJMap, just get the ljtid:
      ljtid1 = LJtids[atid1];
    } else {
      // didn't already have it, so make a new one and assign it:
      ljtid1        = nLJ_;
      LJtids[atid1] = nLJ_;
      nLJ_++;
    }

    ret = LJtypes.insert(atid2);
    if (ret.second == false) {
      // already had this type in the LJMap, just get the ljtid:
      ljtid2 = LJtids[atid2];
    } else {
      // didn't already have it, so make a new one and assign it:
      ljtid2        = nLJ_;
      LJtids[atid2] = nLJ_;
      nLJ_++;
    }

    MixingMap.resize(nLJ_);
    MixingMap[ljtid1].resize(nLJ_);

    MixingMap[ljtid1][ljtid2] = mixer;
    if (ljtid2 != ljtid1) {
      MixingMap[ljtid2].resize(nLJ_);
      MixingMap[ljtid2][ljtid1] = mixer;
    }
  }